

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_op_keepdims<std::plus<float>,std::plus<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  byte in_CL;
  byte in_DL;
  Mat *in_RSI;
  Mat *in_RDI;
  byte in_R8B;
  float in_XMM0_Da;
  float fVar3;
  int j_7;
  int i_13;
  float *outptr_2;
  float *ptr_10;
  int q_8;
  int i_12;
  float *ptr_9;
  int q_7;
  int j_6;
  float *mins_ptr_3;
  int q_6;
  int j_5;
  int i_11;
  float *mins_ptr_2;
  float *ptr_8;
  int q_5;
  Mat mins_1;
  int i_10;
  float *mins_ptr_1;
  int q_4;
  int j_4;
  float sum_8;
  int i_9;
  float *mins_ptr;
  float *ptr_7;
  int q_3;
  Mat mins;
  int j_3;
  float sum_7;
  int i_8;
  float *outptr_1;
  float *ptr_6;
  int q_2;
  int i_7;
  float sum_6;
  float *outptr;
  float *ptr_5;
  int q_1;
  int i_6;
  float sum_4;
  int i_5;
  float sum_5;
  float *ptr_4;
  int q;
  Mat sums_1;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_2;
  float *ptr_3;
  int i_4;
  int j_1;
  float sum_3;
  float *ptr_2;
  int i_3;
  int i_2;
  float sum_1;
  int j;
  float sum_2;
  float *ptr_1;
  int i_1;
  Mat sums;
  int h;
  int w_1;
  int i;
  float sum;
  float *ptr;
  int w;
  int dims;
  size_t elemsize;
  plus<float> op2;
  plus<float> op;
  Allocator *in_stack_fffffffffffff7f8;
  Mat *in_stack_fffffffffffff800;
  Mat *in_stack_fffffffffffff808;
  Mat *in_stack_fffffffffffff810;
  int _c;
  Mat *this;
  int _h;
  undefined8 in_stack_fffffffffffff818;
  int _w;
  undefined4 in_stack_fffffffffffff820;
  undefined4 in_stack_fffffffffffff824;
  int local_648;
  int local_644;
  Mat local_640;
  Mat *local_600;
  Mat local_5f8;
  float *local_5b8;
  int local_5b0;
  int local_5ac;
  Mat local_5a8;
  float *local_568;
  int local_560;
  int local_55c;
  Mat local_558;
  float *local_518;
  int local_50c;
  int local_508;
  int local_504;
  Mat local_500;
  float *local_4c0;
  Mat local_4b8;
  float *local_478;
  int local_46c;
  int local_424;
  Mat local_420;
  float *local_3e0;
  int local_3d8;
  int local_3d4;
  float local_3d0;
  int local_3cc;
  Mat local_3c8;
  float *local_388;
  Mat local_380;
  float *local_340;
  int local_334;
  int local_2ec;
  float local_2e8;
  int local_2e4;
  Mat local_2e0;
  float *local_2a0;
  Mat local_298;
  float *local_258;
  int local_24c;
  int local_248;
  float local_244;
  Mat local_240;
  float *local_200;
  Mat local_1f8;
  float *local_1b8;
  int local_1ac;
  int local_1a8;
  float local_1a4;
  int local_1a0;
  float local_19c;
  Mat local_198;
  float *local_158;
  int local_14c;
  Mat local_148;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  float *local_f0;
  int local_e4;
  int local_e0;
  float local_dc;
  float *local_d8;
  int local_cc;
  int local_c8;
  float local_c4;
  int local_c0;
  float local_bc;
  float *local_b8;
  int local_ac;
  undefined4 local_a8;
  Mat local_98;
  int local_58;
  int local_54;
  int local_50;
  float local_4c;
  float *local_48;
  int local_40;
  int local_3c;
  size_t local_38;
  plus<float> local_2a;
  plus<float> local_29 [10];
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_1d = in_DL & 1;
  local_1e = in_CL & 1;
  local_1f = in_R8B & 1;
  local_38 = in_RDI->elemsize;
  local_3c = in_RDI->dims;
  _w = (int)((ulong)in_stack_fffffffffffff818 >> 0x20);
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (local_3c == 1) {
    local_40 = in_RDI->w;
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,
                (size_t)in_stack_fffffffffffff810,(Allocator *)in_stack_fffffffffffff808);
    local_48 = Mat::operator_cast_to_float_(local_10);
    local_4c = local_1c;
    for (local_50 = 0; fVar3 = local_4c, local_50 < local_40; local_50 = local_50 + 1) {
      local_4c = std::plus<float>::operator()(local_29,&local_4c,local_48 + local_50);
    }
    pfVar2 = Mat::operator[](local_18,0);
    *pfVar2 = fVar3;
    return 0;
  }
  _h = (int)in_stack_fffffffffffff818;
  if (local_3c == 2) {
    local_54 = in_RDI->w;
    local_58 = in_RDI->h;
    if ((local_1d != 0) && (local_1e != 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,
                  (size_t)in_stack_fffffffffffff810,(Allocator *)in_stack_fffffffffffff808);
      Mat::Mat(in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (size_t)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      bVar1 = Mat::empty(in_stack_fffffffffffff800);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_ac = 0; local_ac < local_58; local_ac = local_ac + 1) {
          local_b8 = Mat::row(local_10,local_ac);
          local_bc = local_1c;
          for (local_c0 = 0; fVar3 = local_bc, local_c0 < local_54; local_c0 = local_c0 + 1) {
            local_bc = std::plus<float>::operator()(local_29,&local_bc,local_b8 + local_c0);
          }
          pfVar2 = Mat::operator[](&local_98,local_ac);
          *pfVar2 = fVar3;
        }
        local_c4 = local_1c;
        for (local_c8 = 0; fVar3 = local_c4, local_c8 < local_58; local_c8 = local_c8 + 1) {
          pfVar2 = Mat::operator[](&local_98,local_c8);
          local_c4 = std::plus<float>::operator()(&local_2a,&local_c4,pfVar2);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_a8 = 1;
      Mat::~Mat((Mat *)0x172aef);
      return local_4;
    }
    if ((local_1d != 0) && (local_1e == 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,
                  (size_t)in_stack_fffffffffffff810,(Allocator *)in_stack_fffffffffffff808);
      for (local_cc = 0; local_cc < local_58; local_cc = local_cc + 1) {
        local_d8 = Mat::row(local_10,local_cc);
        local_dc = local_1c;
        for (local_e0 = 0; fVar3 = local_dc, local_e0 < local_54; local_e0 = local_e0 + 1) {
          local_dc = std::plus<float>::operator()(local_29,&local_dc,local_d8 + local_e0);
        }
        pfVar2 = Mat::operator[](local_18,local_cc);
        *pfVar2 = fVar3;
      }
      return 0;
    }
    if ((local_1d == 0) && (local_1e != 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,
                  (size_t)in_stack_fffffffffffff810,(Allocator *)in_stack_fffffffffffff808);
      Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
      for (local_e4 = 0; local_e4 < local_58; local_e4 = local_e4 + 1) {
        local_f0 = Mat::row(local_10,local_e4);
        for (local_f4 = 0; local_f4 < local_54; local_f4 = local_f4 + 1) {
          pfVar2 = Mat::operator[](local_18,local_f4);
          fVar3 = std::plus<float>::operator()(local_29,pfVar2,local_f0 + local_f4);
          pfVar2 = Mat::operator[](local_18,local_f4);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
  }
  if (local_3c == 3) {
    local_f8 = in_RDI->w;
    local_fc = in_RDI->h;
    local_100 = in_RDI->c;
    local_104 = local_f8 * local_fc;
    _c = (int)((ulong)in_stack_fffffffffffff810 >> 0x20);
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      Mat::Mat(in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (size_t)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
      bVar1 = Mat::empty(in_stack_fffffffffffff800);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_14c = 0; local_14c < local_100; local_14c = local_14c + 1) {
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_198);
          Mat::~Mat((Mat *)0x172f36);
          local_19c = local_1c;
          local_158 = pfVar2;
          for (local_1a0 = 0; fVar3 = local_19c, local_1a0 < local_104; local_1a0 = local_1a0 + 1) {
            local_19c = std::plus<float>::operator()(local_29,&local_19c,local_158 + local_1a0);
          }
          pfVar2 = Mat::operator[](&local_148,local_14c);
          *pfVar2 = fVar3;
        }
        local_1a4 = local_1c;
        for (local_1a8 = 0; fVar3 = local_1a4, local_1a8 < local_100; local_1a8 = local_1a8 + 1) {
          pfVar2 = Mat::operator[](&local_148,local_1a8);
          local_1a4 = std::plus<float>::operator()(&local_2a,&local_1a4,pfVar2);
        }
        pfVar2 = Mat::operator[](local_18,0);
        *pfVar2 = fVar3;
        local_4 = 0;
      }
      local_a8 = 1;
      Mat::~Mat((Mat *)0x173148);
      return local_4;
    }
    if (((local_1d != 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      for (local_1ac = 0; local_1ac < local_100; local_1ac = local_1ac + 1) {
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_1f8);
        Mat::~Mat((Mat *)0x17321f);
        local_1b8 = pfVar2;
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_240);
        Mat::~Mat((Mat *)0x173277);
        local_244 = local_1c;
        local_200 = pfVar2;
        for (local_248 = 0; local_248 < local_104; local_248 = local_248 + 1) {
          local_244 = std::plus<float>::operator()(local_29,&local_244,local_1b8 + local_248);
        }
        *local_200 = local_244;
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f == 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      for (local_24c = 0; local_24c < local_100; local_24c = local_24c + 1) {
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_298);
        Mat::~Mat((Mat *)0x17344c);
        local_258 = pfVar2;
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_2e0);
        Mat::~Mat((Mat *)0x1734a4);
        local_2a0 = pfVar2;
        for (local_2e4 = 0; local_2e4 < local_fc; local_2e4 = local_2e4 + 1) {
          local_2e8 = local_1c;
          for (local_2ec = 0; local_2ec < local_f8; local_2ec = local_2ec + 1) {
            local_2e8 = std::plus<float>::operator()(local_29,&local_2e8,local_258 + local_2ec);
          }
          local_2a0[local_2e4] = local_2e8;
          local_258 = local_258 + local_f8;
        }
      }
      return 0;
    }
    if (((local_1d != 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      Mat::Mat(in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (int)in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20),
               (size_t)in_stack_fffffffffffff7f8,(Allocator *)0x1736b3);
      bVar1 = Mat::empty(in_stack_fffffffffffff800);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
        for (local_334 = 0; local_334 < local_100; local_334 = local_334 + 1) {
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_380);
          Mat::~Mat((Mat *)0x173783);
          local_340 = pfVar2;
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_3c8);
          Mat::~Mat((Mat *)0x1737d5);
          local_388 = pfVar2;
          for (local_3cc = 0; local_3cc < local_fc; local_3cc = local_3cc + 1) {
            local_3d0 = local_1c;
            for (local_3d4 = 0; local_3d4 < local_f8; local_3d4 = local_3d4 + 1) {
              local_3d0 = std::plus<float>::operator()(local_29,&local_3d0,local_340 + local_3d4);
            }
            local_388[local_3cc] = local_3d0;
            local_340 = local_340 + local_f8;
          }
        }
        Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
        for (local_3d8 = 0; local_3d8 < local_100; local_3d8 = local_3d8 + 1) {
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_420);
          Mat::~Mat((Mat *)0x1739c0);
          local_3e0 = pfVar2;
          for (local_424 = 0; local_424 < local_fc; local_424 = local_424 + 1) {
            pfVar2 = Mat::operator[](local_18,local_424);
            fVar3 = std::plus<float>::operator()(&local_2a,pfVar2,local_3e0 + local_424);
            pfVar2 = Mat::operator[](local_18,local_424);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_a8 = 1;
      Mat::~Mat((Mat *)0x173ae8);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f != 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      Mat::Mat(in_stack_fffffffffffff810,(int)((ulong)in_stack_fffffffffffff808 >> 0x20),
               (int)in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20),
               (size_t)in_stack_fffffffffffff7f8,(Allocator *)0x173b97);
      bVar1 = Mat::empty(in_stack_fffffffffffff800);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
        for (local_46c = 0; local_46c < local_100; local_46c = local_46c + 1) {
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_4b8);
          Mat::~Mat((Mat *)0x173c64);
          local_478 = pfVar2;
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_500);
          Mat::~Mat((Mat *)0x173cb0);
          local_4c0 = pfVar2;
          for (local_504 = 0; local_504 < local_fc; local_504 = local_504 + 1) {
            for (local_508 = 0; local_508 < local_f8; local_508 = local_508 + 1) {
              fVar3 = std::plus<float>::operator()
                                (local_29,local_4c0 + local_508,local_478 + local_508);
              local_4c0[local_508] = fVar3;
            }
            local_478 = local_478 + local_f8;
          }
        }
        Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
        for (local_50c = 0; local_50c < local_100; local_50c = local_50c + 1) {
          Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_558);
          Mat::~Mat((Mat *)0x173e6f);
          local_518 = pfVar2;
          for (local_55c = 0; local_55c < local_f8; local_55c = local_55c + 1) {
            pfVar2 = Mat::operator[](local_18,local_55c);
            fVar3 = std::plus<float>::operator()(&local_2a,pfVar2,local_518 + local_55c);
            pfVar2 = Mat::operator[](local_18,local_55c);
            *pfVar2 = fVar3;
          }
        }
        local_4 = 0;
      }
      local_a8 = 1;
      Mat::~Mat((Mat *)0x173f82);
      return local_4;
    }
    if (((local_1d == 0) && (local_1e == 0)) && (local_1f != 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
      for (local_560 = 0; local_560 < local_100; local_560 = local_560 + 1) {
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(&local_5a8);
        Mat::~Mat((Mat *)0x17406b);
        local_568 = pfVar2;
        for (local_5ac = 0; local_5ac < local_104; local_5ac = local_5ac + 1) {
          pfVar2 = Mat::operator[](local_18,local_5ac);
          fVar3 = std::plus<float>::operator()(local_29,pfVar2,local_568 + local_5ac);
          pfVar2 = Mat::operator[](local_18,local_5ac);
          *pfVar2 = fVar3;
        }
      }
      return 0;
    }
    if (((local_1d == 0) && (local_1e != 0)) && (local_1f == 0)) {
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff824,in_stack_fffffffffffff820),_w,_h,_c,
                  (size_t)in_stack_fffffffffffff808,(Allocator *)in_stack_fffffffffffff800);
      Mat::fill(in_stack_fffffffffffff810,(float)((ulong)in_stack_fffffffffffff808 >> 0x20));
      for (local_5b0 = 0; local_5b0 < local_100; local_5b0 = local_5b0 + 1) {
        this = &local_5f8;
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        pfVar2 = Mat::operator_cast_to_float_(this);
        Mat::~Mat((Mat *)0x17422c);
        in_stack_fffffffffffff800 = &local_640;
        local_5b8 = pfVar2;
        Mat::channel(in_stack_fffffffffffff808,(int)((ulong)in_stack_fffffffffffff800 >> 0x20));
        in_stack_fffffffffffff808 = (Mat *)Mat::operator_cast_to_float_(in_stack_fffffffffffff800);
        Mat::~Mat((Mat *)0x174278);
        local_600 = in_stack_fffffffffffff808;
        for (local_644 = 0; local_644 < local_fc; local_644 = local_644 + 1) {
          for (local_648 = 0; local_648 < local_f8; local_648 = local_648 + 1) {
            fVar3 = std::plus<float>::operator()
                              (local_29,(float *)((long)&local_600->data + (long)local_648 * 4),
                               local_5b8 + local_648);
            *(float *)((long)&local_600->data + (long)local_648 * 4) = fVar3;
          }
          local_5b8 = local_5b8 + local_f8;
        }
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int reduction_op_keepdims(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i=0; i<w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> 1 1
            b.create(1, 1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i=0; i<h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> 1 h
            b.create(1, h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j=0; j<w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }

            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w 1
            b.create(w, 1, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i=0; i<h; i++)
            {
                const float* ptr = a.row(i);
                for (int j=0; j<w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }

            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> 1 1 1
            b.create(1, 1, 1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i=0; i<channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> 1 1 c
            b.create(1, 1, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                float sum = v0;
                for (int i=0; i<size; i++)
                {
                    sum = op(sum, ptr[i]);
                }

                outptr[0] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> 1 h c
            b.create(1, h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> 1 h 1
            b.create(1, h, 1, elemsize, opt.blob_allocator);

            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    float sum = v0;
                    for (int j=0; j<w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }
            
            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i=0; i<h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w 1 1
            b.create(w, 1, 1, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j=0; j<w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h 1
            b.create(w, h, 1, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i=0; i<size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w 1 c
            b.create(w, 1, channels, elemsize, opt.blob_allocator);
            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.channel(q);

                for (int i=0; i<h; i++)
                {
                    for (int j=0; j<w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            return 0;
        }
    }

    return 0;
}